

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall TPZMatrix<Fad<double>_>::Identity(TPZMatrix<Fad<double>_> *this)

{
  Fad<double> *pFVar1;
  Fad<double> *pFVar2;
  int64_t iVar3;
  int64_t iVar4;
  TPZBaseMatrix *in_RDI;
  int64_t col;
  int64_t row;
  char *in_stack_00000128;
  char *in_stack_00000130;
  Fad<double> *in_stack_ffffffffffffff30;
  Fad<double> *in_stack_ffffffffffffff38;
  Fad<double> *in_stack_ffffffffffffff40;
  undefined1 local_78 [55];
  byte local_41;
  undefined8 local_40;
  undefined1 local_38 [32];
  Fad<double> *local_18;
  Fad<double> *local_10;
  
  iVar3 = TPZBaseMatrix::Cols(in_RDI);
  iVar4 = TPZBaseMatrix::Rows(in_RDI);
  if (iVar3 != iVar4) {
    Error(in_stack_00000130,in_stack_00000128);
  }
  for (local_10 = (Fad<double> *)0x0; pFVar1 = local_10, iVar3 = TPZBaseMatrix::Rows(in_RDI),
      (long)pFVar1 < iVar3; local_10 = (Fad<double> *)((long)&local_10->val_ + 1)) {
    for (local_18 = (Fad<double> *)0x0; pFVar1 = local_18, iVar3 = TPZBaseMatrix::Cols(in_RDI),
        pFVar2 = local_18, (long)pFVar1 < iVar3;
        local_18 = (Fad<double> *)((long)&local_18->val_ + 1)) {
      local_41 = 0;
      if (local_10 == local_18) {
        local_40 = 0x3ff0000000000000;
        in_stack_ffffffffffffff40 = local_10;
        Fad<double>::Fad<double,_nullptr>(local_10,&in_stack_ffffffffffffff38->val_);
        local_41 = 1;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_ffffffffffffff40,pFVar2,local_38);
      }
      else {
        in_stack_ffffffffffffff30 = local_10;
        in_stack_ffffffffffffff38 = local_18;
        Fad<double>::Fad<double,_nullptr>(in_stack_ffffffffffffff40,&local_18->val_);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                  (in_RDI,in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,local_78);
        Fad<double>::~Fad(in_stack_ffffffffffffff30);
      }
      if ((local_41 & 1) != 0) {
        Fad<double>::~Fad(in_stack_ffffffffffffff30);
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Identity() {
	
    if ( Cols() != Rows() ) {
        Error( "identity (TPZMatrix<>*) <TPZMatrix<>must be square>" );
    }
    for ( int64_t row = 0; row < Rows(); row++) {
        for ( int64_t col = 0; col < Cols(); col++ ) {
            (row == col)? PutVal(row,col,1.):PutVal(row,col,0.);
        }
    }
}